

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void new_handler_terminate(void)

{
  string_view logging_function;
  string_view source_file;
  
  std::set_new_handler(std::terminate);
  logging_function._M_str = "new_handler_terminate";
  logging_function._M_len = 0x15;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp";
  source_file._M_len = 0x58;
  LogPrintFormatInternal<>
            (logging_function,source_file,0x348,ALL,Error,(ConstevalFormatString<0U>)0x7e4026);
  std::terminate();
}

Assistant:

[[noreturn]] static void new_handler_terminate()
{
    // Rather than throwing std::bad-alloc if allocation fails, terminate
    // immediately to (try to) avoid chain corruption.
    // Since logging may itself allocate memory, set the handler directly
    // to terminate first.
    std::set_new_handler(std::terminate);
    LogError("Out of memory. Terminating.\n");

    // The log was successful, terminate now.
    std::terminate();
}